

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vector.cpp
# Opt level: O2

Reals Omega_h::repeat_vector<9>(LO n,Vector<9> v)

{
  long lVar1;
  void *extraout_RDX;
  int in_ESI;
  Vector<9> *pVVar2;
  undefined4 in_register_0000003c;
  Vector<9> *pVVar3;
  byte bVar4;
  Reals RVar5;
  allocator local_89;
  Write<double> vs;
  Write<signed_char> local_78;
  type_conflict4 f;
  
  bVar4 = 0;
  std::__cxx11::string::string((string *)&f,"",&local_89);
  Write<double>::Write(&vs,in_ESI * 9,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<double>::Write(&f.vs,&vs);
  pVVar2 = &v;
  pVVar3 = &f.v;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pVVar3->super_Few<double,_9>).array_[0] = (pVVar2->super_Few<double,_9>).array_[0];
    pVVar2 = (Vector<9> *)((long)pVVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    pVVar3 = (Vector<9> *)((long)pVVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  parallel_for<Omega_h::repeat_vector<9>(int,Omega_h::Vector<9>)::_lambda(int)_1_>
            (in_ESI,&f,"repeat_vector");
  Write<double>::Write(&local_78,(Write<signed_char> *)&vs);
  Read<double>::Read((Read<signed_char> *)CONCAT44(in_register_0000003c,n),
                     (Write<double> *)&local_78);
  Write<double>::~Write((Write<double> *)&local_78);
  Write<double>::~Write(&f.vs);
  Write<double>::~Write(&vs);
  RVar5.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar5.write_.shared_alloc_.alloc = (Alloc *)CONCAT44(in_register_0000003c,n);
  return (Reals)RVar5.write_.shared_alloc_;
}

Assistant:

Reals repeat_vector(LO n, Vector<dim> v) {
  Write<Real> vs(n * dim);
  auto f = OMEGA_H_LAMBDA(LO i) { set_vector(vs, i, v); };
  parallel_for(n, f, "repeat_vector");
  return vs;
}